

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getData(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *val,int *leaveIdx,int idx,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *stab,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *degeneps,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *vec,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *low,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *upp,BreakpointSource src,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *max)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  int iVar5;
  Status SVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  long lVar8;
  uint *puVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  long lVar16;
  byte bVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<200U,_int,_void> local_3c8;
  long local_348;
  cpp_dec_float<200U,_int,_void> *local_340;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar17 = 0;
  lVar16 = (long)idx;
  puVar9 = (uint *)(upd + lVar16);
  pcVar13 = &local_2b0;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar13->data)._M_elems[0] = *puVar9;
    puVar9 = puVar9 + 1;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((pcVar13->data)._M_elems + 1);
  }
  iVar5 = upd[lVar16].m_backend.exp;
  bVar1 = upd[lVar16].m_backend.neg;
  fVar2 = upd[lVar16].m_backend.fpclass;
  iVar3 = upd[lVar16].m_backend.prec_elem;
  puVar9 = (uint *)(upd + lVar16);
  pcVar13 = &local_338;
  local_2b0.exp = iVar5;
  local_2b0.neg = bVar1;
  local_2b0.fpclass = fVar2;
  local_2b0.prec_elem = iVar3;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar13->data)._M_elems[0] = *puVar9;
    puVar9 = puVar9 + 1;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((pcVar13->data)._M_elems + 1);
  }
  local_338.prec_elem = iVar3;
  local_338.fpclass = fVar2;
  local_338.neg = bVar1;
  if ((bVar1 == true) && (local_338.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
    local_338.neg = false;
  }
  local_348 = lVar16;
  local_338.exp = iVar5;
  if (((fVar2 != cpp_dec_float_NaN) && ((stab->m_backend).fpclass != cpp_dec_float_NaN)) &&
     (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_338,&stab->m_backend), iVar5 < 0)) {
    return false;
  }
  *leaveIdx = idx;
  local_3c8.fpclass = cpp_dec_float_finite;
  local_3c8.prec_elem = 0x1c;
  local_3c8.data._M_elems[0] = 0;
  local_3c8.data._M_elems[1] = 0;
  local_3c8.data._M_elems[2] = 0;
  local_3c8.data._M_elems[3] = 0;
  local_3c8.data._M_elems[4] = 0;
  local_3c8.data._M_elems[5] = 0;
  local_3c8.data._M_elems[6] = 0;
  local_3c8.data._M_elems[7] = 0;
  local_3c8.data._M_elems[8] = 0;
  local_3c8.data._M_elems[9] = 0;
  local_3c8.data._M_elems[10] = 0;
  local_3c8.data._M_elems[0xb] = 0;
  local_3c8.data._M_elems[0xc] = 0;
  local_3c8.data._M_elems[0xd] = 0;
  local_3c8.data._M_elems[0xe] = 0;
  local_3c8.data._M_elems[0xf] = 0;
  local_3c8.data._M_elems[0x10] = 0;
  local_3c8.data._M_elems[0x11] = 0;
  local_3c8.data._M_elems[0x12] = 0;
  local_3c8.data._M_elems[0x13] = 0;
  local_3c8.data._M_elems[0x14] = 0;
  local_3c8.data._M_elems[0x15] = 0;
  local_3c8.data._M_elems[0x16] = 0;
  local_3c8.data._M_elems[0x17] = 0;
  local_3c8.data._M_elems[0x18] = 0;
  local_3c8.data._M_elems[0x19] = 0;
  local_3c8.data._M_elems._104_5_ = 0;
  local_3c8.data._M_elems[0x1b]._1_3_ = 0;
  local_3c8.exp = 0;
  local_3c8.neg = false;
  local_340 = &degeneps->m_backend;
  if (&local_3c8 != &max->m_backend) {
    pnVar7 = max;
    pcVar13 = &local_3c8;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pcVar13->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
      pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar7 + ((ulong)bVar17 * -2 + 1) * 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_3c8.exp = (max->m_backend).exp;
    local_3c8.neg = (max->m_backend).neg;
    local_3c8.fpclass = (max->m_backend).fpclass;
    local_3c8.prec_elem = (max->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_3c8,&local_2b0)
  ;
  pnVar7 = low;
  if (local_3c8.fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_338,0,(type *)0x0);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_3c8,&local_338);
    if (0 < iVar5) {
      pnVar7 = upp;
    }
  }
  pnVar10 = pnVar7 + lVar16;
  pnVar14 = val;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  iVar5 = pnVar7[lVar16].m_backend.exp;
  (val->m_backend).exp = iVar5;
  bVar1 = pnVar7[lVar16].m_backend.neg;
  (val->m_backend).neg = bVar1;
  fVar2 = pnVar7[lVar16].m_backend.fpclass;
  (val->m_backend).fpclass = fVar2;
  iVar3 = pnVar7[lVar16].m_backend.prec_elem;
  (val->m_backend).prec_elem = iVar3;
  pcVar13 = &vec[lVar16].m_backend;
  local_3c8.fpclass = cpp_dec_float_finite;
  local_3c8.prec_elem = 0x1c;
  local_3c8.data._M_elems[0] = 0;
  local_3c8.data._M_elems[1] = 0;
  local_3c8.data._M_elems[2] = 0;
  local_3c8.data._M_elems[3] = 0;
  local_3c8.data._M_elems[4] = 0;
  local_3c8.data._M_elems[5] = 0;
  local_3c8.data._M_elems[6] = 0;
  local_3c8.data._M_elems[7] = 0;
  local_3c8.data._M_elems[8] = 0;
  local_3c8.data._M_elems[9] = 0;
  local_3c8.data._M_elems[10] = 0;
  local_3c8.data._M_elems[0xb] = 0;
  local_3c8.data._M_elems[0xc] = 0;
  local_3c8.data._M_elems[0xd] = 0;
  local_3c8.data._M_elems[0xe] = 0;
  local_3c8.data._M_elems[0xf] = 0;
  local_3c8.data._M_elems[0x10] = 0;
  local_3c8.data._M_elems[0x11] = 0;
  local_3c8.data._M_elems[0x12] = 0;
  local_3c8.data._M_elems[0x13] = 0;
  local_3c8.data._M_elems[0x14] = 0;
  local_3c8.data._M_elems[0x15] = 0;
  local_3c8.data._M_elems[0x16] = 0;
  local_3c8.data._M_elems[0x17] = 0;
  local_3c8.data._M_elems[0x18] = 0;
  local_3c8.data._M_elems[0x19] = 0;
  local_3c8.data._M_elems._104_5_ = 0;
  local_3c8.data._M_elems[0x1b]._1_3_ = 0;
  local_3c8.exp = 0;
  local_3c8.neg = false;
  if (&local_3c8 == pcVar13) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&local_3c8,&val->m_backend);
    if (local_3c8.data._M_elems[0] != 0 || local_3c8.fpclass != cpp_dec_float_finite) {
      local_3c8.neg = (bool)(local_3c8.neg ^ 1);
    }
  }
  else {
    if (&local_3c8 != &val->m_backend) {
      pnVar7 = val;
      pcVar12 = &local_3c8;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar7 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_3c8.prec_elem = iVar3;
      local_3c8.fpclass = fVar2;
      local_3c8.exp = iVar5;
      local_3c8.neg = bVar1;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_3c8,pcVar13);
  }
  local_338.fpclass = cpp_dec_float_finite;
  local_338.prec_elem = 0x1c;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems[6] = 0;
  local_338.data._M_elems[7] = 0;
  local_338.data._M_elems[8] = 0;
  local_338.data._M_elems[9] = 0;
  local_338.data._M_elems[10] = 0;
  local_338.data._M_elems[0xb] = 0;
  local_338.data._M_elems[0xc] = 0;
  local_338.data._M_elems[0xd] = 0;
  local_338.data._M_elems[0xe] = 0;
  local_338.data._M_elems[0xf] = 0;
  local_338.data._M_elems[0x10] = 0;
  local_338.data._M_elems[0x11] = 0;
  local_338.data._M_elems[0x12] = 0;
  local_338.data._M_elems[0x13] = 0;
  local_338.data._M_elems[0x14] = 0;
  local_338.data._M_elems[0x15] = 0;
  local_338.data._M_elems[0x16] = 0;
  local_338.data._M_elems[0x17] = 0;
  local_338.data._M_elems[0x18] = 0;
  local_338.data._M_elems[0x19] = 0;
  local_338.data._M_elems._104_5_ = 0;
  local_338.data._M_elems[0x1b]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_338,&local_3c8,&local_2b0);
  pcVar12 = &local_338;
  pnVar7 = val;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar7->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
    pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar7 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  (val->m_backend).exp = local_338.exp;
  (val->m_backend).neg = local_338.neg;
  (val->m_backend).fpclass = local_338.fpclass;
  (val->m_backend).prec_elem = local_338.prec_elem;
  if (((upp[lVar16].m_backend.fpclass == cpp_dec_float_NaN) ||
      (low[lVar16].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&upp[lVar16].m_backend,&low[lVar16].m_backend), iVar5 != 0)) {
    if ((max->m_backend).fpclass == cpp_dec_float_NaN) {
      return true;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_338,0,(type *)0x0);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&max->m_backend,&local_338);
    pcVar12 = local_340;
    if (0 < iVar5) {
      pcVar11 = local_340;
      pcVar15 = &local_3c8;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar15->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
      }
      local_3c8.exp = pcVar12->exp;
      local_3c8.neg = pcVar12->neg;
      local_3c8.fpclass = pcVar12->fpclass;
      local_3c8.prec_elem = pcVar12->prec_elem;
      if (local_3c8.data._M_elems[0] != 0 || local_3c8.fpclass != cpp_dec_float_finite) {
        local_3c8.neg = (bool)(local_3c8.neg ^ 1);
      }
      if (((local_3c8.fpclass != cpp_dec_float_NaN) &&
          ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&val->m_backend,&local_3c8), iVar5 < 0)) goto LAB_005c8eca;
    }
    if ((max->m_backend).fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_338,0,(type *)0x0);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&max->m_backend,&local_338);
      if ((((iVar5 < 0) && ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
          (pcVar12->fpclass != cpp_dec_float_NaN)) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&val->m_backend,pcVar12), 0 < iVar5)) {
LAB_005c8eca:
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)val,0.0);
        pSVar4 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        SVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::dualStatus(&pSVar4->
                              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,(pSVar4->
                              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).theBaseId.data + local_348);
        if (SVar6 == D_ON_BOTH) {
          return true;
        }
        local_3c8.fpclass = cpp_dec_float_finite;
        local_3c8.prec_elem = 0x1c;
        local_3c8.data._M_elems[0] = 0;
        local_3c8.data._M_elems[1] = 0;
        local_3c8.data._M_elems[2] = 0;
        local_3c8.data._M_elems[3] = 0;
        local_3c8.data._M_elems[4] = 0;
        local_3c8.data._M_elems[5] = 0;
        local_3c8.data._M_elems[6] = 0;
        local_3c8.data._M_elems[7] = 0;
        local_3c8.data._M_elems[8] = 0;
        local_3c8.data._M_elems[9] = 0;
        local_3c8.data._M_elems[10] = 0;
        local_3c8.data._M_elems[0xb] = 0;
        local_3c8.data._M_elems[0xc] = 0;
        local_3c8.data._M_elems[0xd] = 0;
        local_3c8.data._M_elems[0xe] = 0;
        local_3c8.data._M_elems[0xf] = 0;
        local_3c8.data._M_elems[0x10] = 0;
        local_3c8.data._M_elems[0x11] = 0;
        local_3c8.data._M_elems[0x12] = 0;
        local_3c8.data._M_elems[0x13] = 0;
        local_3c8.data._M_elems[0x14] = 0;
        local_3c8.data._M_elems[0x15] = 0;
        local_3c8.data._M_elems[0x16] = 0;
        local_3c8.data._M_elems[0x17] = 0;
        local_3c8.data._M_elems[0x18] = 0;
        local_3c8.data._M_elems[0x19] = 0;
        local_3c8.data._M_elems._104_5_ = 0;
        local_3c8.data._M_elems[0x1b]._1_3_ = 0;
        local_3c8.exp = 0;
        local_3c8.neg = false;
        if (&local_3c8 != &max->m_backend) {
          pnVar7 = max;
          pcVar12 = &local_3c8;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar12->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
            pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar7 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar17 * -2 + 1) * 4);
          }
          local_3c8.exp = (max->m_backend).exp;
          local_3c8.neg = (max->m_backend).neg;
          local_3c8.fpclass = (max->m_backend).fpclass;
          local_3c8.prec_elem = (max->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_3c8,&local_2b0);
        if (local_3c8.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_338,0,(type *)0x0);
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_3c8,&local_338);
          if (0 < iVar5) {
            pSVar4 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            pcVar12 = pcVar13;
            pnVar7 = &local_1b0;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              (pnVar7->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
              pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)pnVar7 + ((ulong)bVar17 * -2 + 1) * 4);
            }
            local_1b0.m_backend.exp = pcVar13->exp;
            local_1b0.m_backend.neg = pcVar13->neg;
            local_1b0.m_backend.fpclass = pcVar13->fpclass;
            local_1b0.m_backend.prec_elem = pcVar13->prec_elem;
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftUBbound(pSVar4,idx,&local_1b0);
            return true;
          }
        }
        pSVar4 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        pcVar12 = pcVar13;
        pnVar7 = &local_230;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar7->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
          pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar7 + ((ulong)bVar17 * -2 + 1) * 4);
        }
        local_230.m_backend.exp = pcVar13->exp;
        local_230.m_backend.neg = pcVar13->neg;
        local_230.m_backend.fpclass = pcVar13->fpclass;
        local_230.m_backend.prec_elem = pcVar13->prec_elem;
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftLBbound(pSVar4,idx,&local_230);
        return true;
      }
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)val,0.0);
    pSVar4 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    pcVar12 = pcVar13;
    pnVar7 = &local_b0;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar7->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
      pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar7 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = pcVar13->exp;
    local_b0.m_backend.neg = pcVar13->neg;
    local_b0.m_backend.fpclass = pcVar13->fpclass;
    local_b0.m_backend.prec_elem = pcVar13->prec_elem;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound(pSVar4,idx,&local_b0);
    pSVar4 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    pcVar12 = pcVar13;
    pnVar7 = &local_130;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar7->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
      pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar7 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = pcVar13->exp;
    local_130.m_backend.neg = pcVar13->neg;
    local_130.m_backend.fpclass = pcVar13->fpclass;
    local_130.m_backend.prec_elem = pcVar13->prec_elem;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftUBbound(pSVar4,idx,&local_130);
  }
  return true;
}

Assistant:

bool SPxBoundFlippingRT<R>::getData(
   R&                 val,
   int&                  leaveIdx,
   int                   idx,
   R                  stab,
   R                  degeneps,
   const R*           upd,
   const R*           vec,
   const R*           low,
   const R*           upp,
   BreakpointSource      src,
   R                  max
)
{
   assert(src == FVEC);

   R x = upd[idx];

   // skip breakpoint if it is too small
   if(spxAbs(x) < stab)
   {
      return false;
   }

   leaveIdx = idx;
   val = (max * x > 0) ? upp[idx] : low[idx];
   val = (val - vec[idx]) / x;

   if(upp[idx] == low[idx])
   {
      val = 0.0;
      this->thesolver->shiftLBbound(idx, vec[idx]);
      this->thesolver->shiftUBbound(idx, vec[idx]);
   }
   else if((max > 0 && val < -degeneps) || (max < 0 && val > degeneps))
   {
      val = 0.0;

      if(this->thesolver->dualStatus(this->thesolver->baseId(idx)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(max * x > 0)
            this->thesolver->shiftUBbound(idx, vec[idx]);
         else
            this->thesolver->shiftLBbound(idx, vec[idx]);
      }
   }

   return true;
}